

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.h
# Opt level: O1

void __thiscall imrt::Station::~Station(Station *this)

{
  ~Station(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Station(){ }